

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Window * windowFind(Parse *pParse,Window *pList,char *zName)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  if (pList == (Window *)0x0) {
LAB_0018f4f6:
    sqlite3ErrorMsg(pParse,"no such window: %s");
    return pList;
  }
LAB_0018f4be:
  lVar3 = 0;
  do {
    bVar1 = pList->zName[lVar3];
    bVar2 = zName[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return pList;
  }
  pList = pList->pNextWin;
  if (pList == (Window *)0x0) goto LAB_0018f4f6;
  goto LAB_0018f4be;
}

Assistant:

static Window *windowFind(Parse *pParse, Window *pList, const char *zName){
  Window *p;
  for(p=pList; p; p=p->pNextWin){
    if( sqlite3StrICmp(p->zName, zName)==0 ) break;
  }
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such window: %s", zName);
  }
  return p;
}